

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# code_generator_lite.cc
# Opt level: O3

string * __thiscall
google::protobuf::compiler::StripProto_abi_cxx11_
          (string *__return_storage_ptr__,compiler *this,string_view filename)

{
  size_t sVar1;
  
  sVar1 = filename._M_len;
  if (this < (compiler *)0xb) {
    if (this < (compiler *)0x6) goto LAB_00107e7e;
  }
  else if (*(long *)(this + (sVar1 - 8)) == 0x6c657665646f746f &&
           *(long *)(this + (sVar1 - 0xb)) == 0x65646f746f72702e) {
    if (*(long *)(this + (sVar1 - 8)) == 0x6c657665646f746f &&
        *(long *)(this + (sVar1 - 0xb)) == 0x65646f746f72702e) {
      this = this + -0xb;
    }
    goto LAB_00107e7e;
  }
  if (*(short *)(this + (sVar1 - 2)) == 0x6f74 && *(int *)(this + (sVar1 - 6)) == 0x6f72702e) {
    this = this + -6;
  }
LAB_00107e7e:
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,sVar1,this + sVar1);
  return __return_storage_ptr__;
}

Assistant:

std::string StripProto(absl::string_view filename) {
  if (absl::EndsWith(filename, ".protodevel")) {
    return std::string(absl::StripSuffix(filename, ".protodevel"));
  } else {
    return std::string(absl::StripSuffix(filename, ".proto"));
  }
}